

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_tri_uv_bounding_box(REF_GRID ref_grid,REF_INT node,REF_DBL *uv_min,REF_DBL *uv_max)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  REF_INT cell;
  ulong uVar6;
  long lVar7;
  double dVar8;
  REF_INT id;
  REF_INT sense;
  REF_DBL uv [2];
  REF_INT nodes [27];
  REF_INT local_cc;
  ulong local_c8;
  REF_INT local_bc;
  REF_DBL local_b8 [2];
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  uVar3 = ref_geom_unique_id(ref_geom,node,2,&local_cc);
  uVar6 = (ulong)uVar3;
  if (uVar3 == 0) {
    uVar4 = ref_geom_tuv(ref_geom,node,2,local_cc,uv_min);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5c9,
             "ref_geom_tri_uv_bounding_box",(ulong)uVar4,"uv_min");
      uVar6 = (ulong)uVar4;
    }
    uVar3 = (uint)uVar6;
    if (uVar4 == 0) {
      uVar4 = ref_geom_tuv(ref_geom,node,2,local_cc,uv_max);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x5ca,"ref_geom_tri_uv_bounding_box",(ulong)uVar4,"uv_max");
        uVar6 = (ulong)uVar4;
      }
      uVar3 = (uint)uVar6;
      if (uVar4 == 0) {
        local_c8 = 0xffffffff;
        if (-1 < node) {
          local_c8 = 0xffffffff;
          if (node < ref_cell->ref_adj->nnode) {
            local_c8 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
          }
        }
        if ((int)local_c8 == -1) {
          uVar3 = 0;
        }
        else {
          cell = ref_cell->ref_adj->item[(int)local_c8].ref;
          do {
            uVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x5cd,"ref_geom_tri_uv_bounding_box",(ulong)uVar3,"cell nodes");
              uVar6 = (ulong)uVar3;
            }
            if (uVar3 != 0) {
              return (REF_STATUS)uVar6;
            }
            if (0 < ref_cell->node_per) {
              lVar7 = 0;
              do {
                uVar3 = ref_geom_cell_tuv(ref_geom,local_a8[lVar7],local_a8,2,local_b8,&local_bc);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x5d1,"ref_geom_tri_uv_bounding_box",(ulong)uVar3,"cell uv");
                  uVar6 = (ulong)uVar3;
                }
                if (uVar3 != 0) {
                  return (REF_STATUS)uVar6;
                }
                lVar5 = 0;
                do {
                  dVar8 = uv_min[lVar5];
                  if (local_b8[lVar5] <= uv_min[lVar5]) {
                    dVar8 = local_b8[lVar5];
                  }
                  uv_min[lVar5] = dVar8;
                  lVar5 = lVar5 + 1;
                } while (lVar5 == 1);
                lVar5 = 0;
                do {
                  dVar8 = uv_max[lVar5];
                  if (uv_max[lVar5] <= local_b8[lVar5]) {
                    dVar8 = local_b8[lVar5];
                  }
                  uv_max[lVar5] = dVar8;
                  lVar5 = lVar5 + 1;
                } while (lVar5 == 1);
                lVar7 = lVar7 + 1;
              } while (lVar7 < ref_cell->node_per);
            }
            pRVar2 = ref_cell->ref_adj->item;
            iVar1 = pRVar2[(int)local_c8].next;
            local_c8 = (ulong)iVar1;
            if (local_c8 == 0xffffffffffffffff) {
              cell = -1;
            }
            else {
              cell = pRVar2[local_c8].ref;
            }
            uVar3 = 0;
          } while (iVar1 != -1);
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5c8,
           "ref_geom_tri_uv_bounding_box",uVar6,"id");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_uv_bounding_box(REF_GRID ref_grid, REF_INT node,
                                                REF_DBL *uv_min,
                                                REF_DBL *uv_max) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_node, id, iuv;
  REF_DBL uv[2];
  REF_INT sense;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  /* get face id and initialize min and max */
  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "id");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_min), "uv_min");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_max), "uv_max");

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_geom_cell_tuv(ref_geom, nodes[cell_node], nodes, REF_GEOM_FACE,
                            uv, &sense),
          "cell uv");
      for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = MIN(uv_min[iuv], uv[iuv]);
      for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = MAX(uv_max[iuv], uv[iuv]);
    }
  }

  return REF_SUCCESS;
}